

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O1

void __thiscall QPainter::save(QPainter *this)

{
  _Head_base<0UL,_QPainterPrivate_*,_false> this_00;
  _Head_base<0UL,_QPainterState_*,_false> _Var1;
  QPainterState *pQVar2;
  _func_int ***ppp_Var3;
  int iVar4;
  undefined4 extraout_var;
  QPainterState *this_01;
  QPaintEngineState *pQVar5;
  pointer *__ptr;
  long in_FS_OFFSET;
  unique_ptr<QPainterState,_std::default_delete<QPainterState>_> prev;
  _Head_base<0UL,_QPainterState_*,_false> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00._M_head_impl =
       (this->d_ptr)._M_t.
       super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
       super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
       super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl;
  if (((this_00._M_head_impl)->engine)._M_t.
      super___uniq_ptr_impl<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor>._M_t.
      super__Tuple_impl<0UL,_QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor>.
      super__Head_base<0UL,_QPaintEngine_*,_false>._M_head_impl == (QPaintEngine *)0x0) {
    save();
  }
  else {
    local_28._M_head_impl = (QPainterState *)0x0;
    if ((this_00._M_head_impl)->extended == (QPaintEngineEx *)0x0) {
      QPainterPrivate::updateState
                (this_00._M_head_impl,
                 ((this_00._M_head_impl)->state)._M_t.
                 super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>._M_t.
                 super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>.
                 super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl);
      pQVar2 = ((this_00._M_head_impl)->state)._M_t.
               super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>._M_t.
               super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>.
               super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl;
      this_01 = (QPainterState *)operator_new(0x1c0);
      QPainterState::QPainterState(this_01,pQVar2);
      _Var1._M_head_impl =
           ((this_00._M_head_impl)->state)._M_t.
           super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>._M_t.
           super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>.
           super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl;
      ((this_00._M_head_impl)->state)._M_t.
      super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>._M_t.
      super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>.
      super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl = this_01;
      if (local_28._M_head_impl != (QPainterState *)0x0) {
        ppp_Var3 = &(local_28._M_head_impl)->_vptr_QPainterState;
        local_28._M_head_impl = _Var1._M_head_impl;
        (*(*ppp_Var3)[1])();
        _Var1._M_head_impl = local_28._M_head_impl;
      }
      local_28._M_head_impl = _Var1._M_head_impl;
      pQVar2 = ((this_00._M_head_impl)->state)._M_t.
               super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>._M_t.
               super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>.
               super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl;
      pQVar5 = &pQVar2->super_QPaintEngineState;
      if (pQVar2 == (QPainterState *)0x0) {
        pQVar5 = (QPaintEngineState *)0x0;
      }
      (((this_00._M_head_impl)->engine)._M_t.
       super___uniq_ptr_impl<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor>._M_t.
       super__Tuple_impl<0UL,_QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor>.
       super__Head_base<0UL,_QPaintEngine_*,_false>._M_head_impl)->state = pQVar5;
    }
    else {
      iVar4 = (*((this_00._M_head_impl)->extended->super_QPaintEngine)._vptr_QPaintEngine[0x18])();
      _Var1._M_head_impl =
           ((this_00._M_head_impl)->state)._M_t.
           super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>._M_t.
           super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>.
           super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl;
      ((this_00._M_head_impl)->state)._M_t.
      super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>._M_t.
      super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>.
      super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl =
           (QPainterState *)CONCAT44(extraout_var,iVar4);
      if (local_28._M_head_impl != (QPainterState *)0x0) {
        ppp_Var3 = &(local_28._M_head_impl)->_vptr_QPainterState;
        local_28._M_head_impl = _Var1._M_head_impl;
        (*(*ppp_Var3)[1])();
        _Var1._M_head_impl = local_28._M_head_impl;
      }
      local_28._M_head_impl = _Var1._M_head_impl;
      (*((this_00._M_head_impl)->extended->super_QPaintEngine)._vptr_QPaintEngine[0x2f])
                ((this_00._M_head_impl)->extended,
                 ((this_00._M_head_impl)->state)._M_t.
                 super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>._M_t.
                 super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>.
                 super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl);
    }
    QVLABase<std::unique_ptr<QPainterState,std::default_delete<QPainterState>>>::
    emplace_back_impl<std::unique_ptr<QPainterState,std::default_delete<QPainterState>>>
              ((QVLABase<std::unique_ptr<QPainterState,std::default_delete<QPainterState>>> *)
               &(this_00._M_head_impl)->savedStates,8,
               &((this_00._M_head_impl)->savedStates).
                super_stack<std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>,_QVarLengthArray<std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>,_8LL>_>
                .c.super_QVLAStorage<8UL,_8UL,_8LL>,
               (unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)&local_28);
    if (local_28._M_head_impl != (QPainterState *)0x0) {
      (*(local_28._M_head_impl)->_vptr_QPainterState[1])();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPainter::save()
{
#ifdef QT_DEBUG_DRAW
    if (qt_show_painter_debug_output)
        printf("QPainter::save()\n");
#endif
    Q_D(QPainter);
    if (!d->engine) {
        qWarning("QPainter::save: Painter not active");
        return;
    }

    std::unique_ptr<QPainterState> prev;
    if (d->extended) {
        // separate the creation of a new state from the update of d->state, since some
        // engines access d->state directly (not via createState()'s argument)
        std::unique_ptr<QPainterState> next(d->extended->createState(d->state.get()));
        prev = std::exchange(d->state, std::move(next));
        d->extended->setState(d->state.get());
    } else {
        d->updateState(d->state);
        prev = std::exchange(d->state, std::make_unique<QPainterState>(d->state.get()));
        d->engine->state = d->state.get();
    }
    d->savedStates.push(std::move(prev));
}